

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_modinv64_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  int64_t *piVar1;
  ulong *puVar2;
  secp256k1_scalar *a;
  ushort *puVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int64_t iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar17;
  uint64_t uVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar25;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar26;
  secp256k1_modinv32_signed30 *b_00;
  long *extraout_RDX_01;
  uint uVar27;
  long lVar28;
  code *pcVar29;
  secp256k1_modinv64_modinfo *psVar30;
  secp256k1_modinv64_modinfo *psVar31;
  int *piVar32;
  secp256k1_modinv32_signed30 *psVar33;
  secp256k1_fe *psVar34;
  uint uVar35;
  uint uVar36;
  secp256k1_modinv64_modinfo *psVar37;
  uint8_t *puVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  secp256k1_modinv32_signed30 *psVar43;
  secp256k1_fe *psVar44;
  secp256k1_fe *psVar45;
  secp256k1_fe *r;
  secp256k1_modinv64_modinfo *psVar46;
  secp256k1_modinv64_modinfo *psVar47;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar48;
  ulong uVar49;
  secp256k1_fe *r_00;
  uchar *__s;
  uint uVar50;
  ulong uVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  secp256k1_modinv64_modinfo *psVar55;
  int *piVar56;
  uint uVar57;
  secp256k1_modinv64_modinfo *psVar58;
  secp256k1_modinv32_modinfo *modinfo;
  secp256k1_modinv32_modinfo *psVar59;
  secp256k1_modinv32_signed30 *psVar60;
  uint uVar61;
  secp256k1_modinv64_modinfo *psVar62;
  secp256k1_modinv32_signed30 *psVar63;
  size_t count;
  uint uVar64;
  secp256k1_modinv64_modinfo *psVar65;
  code *pcVar66;
  bool bVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  secp256k1_modinv64_signed62 x;
  secp256k1_modinv64_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  ulong uStack_1748;
  secp256k1_fe *psStack_1740;
  uchar auStack_1738 [4232];
  secp256k1_fe *psStack_6b0;
  code *pcStack_6a8;
  undefined8 uStack_6a0;
  secp256k1_fe *psStack_698;
  code *pcStack_690;
  code *pcStack_688;
  undefined1 auStack_680 [36];
  int iStack_65c;
  int iStack_658;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  int iStack_648;
  int iStack_644;
  undefined1 auStack_640 [48];
  code *pcStack_610;
  secp256k1_fe sStack_608;
  secp256k1_fe sStack_5d8;
  secp256k1_fe sStack_5a8;
  ulong uStack_570;
  ulong uStack_568;
  ulong uStack_560;
  secp256k1_modinv32_signed30 *psStack_558;
  ulong uStack_550;
  code *pcStack_548;
  uint uStack_540;
  uint uStack_53c;
  uint uStack_538;
  uint uStack_534;
  uint uStack_530;
  uint uStack_52c;
  secp256k1_modinv32_signed30 *psStack_528;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  int32_t iStack_50c;
  secp256k1_modinv32_signed30 *psStack_508;
  secp256k1_modinv32_signed30 *psStack_500;
  secp256k1_modinv32_signed30 *psStack_4f8;
  secp256k1_modinv32_signed30 *psStack_4f0;
  secp256k1_modinv32_signed30 *psStack_4e8;
  code *pcStack_4e0;
  long lStack_4d0;
  long lStack_4c8;
  int *piStack_4c0;
  secp256k1_modinv32_modinfo *psStack_4b8;
  ulong uStack_4b0;
  ulong uStack_4a0;
  code *pcStack_498;
  secp256k1_modinv32_signed30 *psStack_490;
  int *piStack_480;
  secp256k1_modinv32_modinfo *psStack_478;
  ulong uStack_470;
  ulong uStack_460;
  code *pcStack_458;
  secp256k1_modinv32_signed30 sStack_450;
  secp256k1_modinv32_signed30 sStack_42c;
  secp256k1_modinv64_modinfo *psStack_408;
  secp256k1_modinv64_modinfo *psStack_400;
  secp256k1_modinv32_modinfo *psStack_3f0;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  secp256k1_modinv64_modinfo sStack_3d8;
  secp256k1_modinv32_trans2x2 sStack_3a8;
  secp256k1_modinv64_modinfo sStack_398;
  secp256k1_modinv64_modinfo *psStack_368;
  long lStack_360;
  secp256k1_modinv64_modinfo sStack_358;
  secp256k1_modinv32_signed30 sStack_328;
  secp256k1_modinv64_modinfo *psStack_300;
  secp256k1_modinv32_modinfo *psStack_2f8;
  secp256k1_modinv64_modinfo *psStack_2f0;
  secp256k1_modinv64_modinfo *psStack_2e8;
  secp256k1_modinv64_modinfo *psStack_2e0;
  code *pcStack_2d8;
  uint uStack_2c4;
  secp256k1_modinv32_trans2x2 sStack_2c0;
  secp256k1_modinv64_modinfo sStack_2b0;
  secp256k1_modinv64_modinfo sStack_280;
  secp256k1_modinv64_modinfo *psStack_250;
  secp256k1_modinv64_modinfo *psStack_248;
  secp256k1_modinv64_modinfo sStack_240;
  secp256k1_modinv32_signed30 sStack_210;
  secp256k1_modinv64_modinfo *psStack_1e8;
  secp256k1_modinv64_modinfo *psStack_1e0;
  ulong uStack_1d8;
  secp256k1_modinv64_modinfo *psStack_1d0;
  secp256k1_modinv64_modinfo *psStack_1c8;
  secp256k1_modinv64_modinfo *psStack_1c0;
  int iStack_1b0;
  int iStack_1ac;
  secp256k1_modinv32_trans2x2 sStack_1a8;
  secp256k1_modinv64_modinfo sStack_198;
  secp256k1_modinv64_modinfo sStack_168;
  secp256k1_modinv64_modinfo *psStack_138;
  secp256k1_modinv64_modinfo *psStack_130;
  ulong uStack_128;
  secp256k1_modinv64_modinfo *psStack_120;
  secp256k1_modinv64_modinfo *psStack_118;
  ulong uStack_110;
  uint16_t *puStack_108;
  uint16_t *puStack_100;
  code *pcStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv64_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  
  psVar47 = &local_e8;
  psVar30 = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4] = 0;
  uVar40 = 0;
  psVar37 = (secp256k1_modinv64_modinfo *)0x8421084210842109;
  do {
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar40 >> 1;
    puVar2 = (ulong *)((long)local_e8.modulus.v +
                      (ulong)((uint)((uVar40 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8))
    ;
    *puVar2 = *puVar2 | (ulong)((in[uVar40 >> 4 & 0xfffffff] >> ((uint)uVar40 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar72 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar40 & 0x3fU);
    uVar40 = uVar40 + 1;
  } while ((int)uVar40 != 0x100);
  psVar58 = (secp256k1_modinv64_modinfo *)
            (local_e8.modulus.v[1] | local_e8.modulus.v[0] | local_e8.modulus.v[2] |
             local_e8.modulus.v[3] | local_e8.modulus.v[4]);
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4] = 0;
  psVar62 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)psVar62 >> 1;
    puVar2 = (ulong *)((long)local_b8.modulus.v +
                      (ulong)((uint)(((ulong)psVar62 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                             0xfffffff8));
    *puVar2 = *puVar2 | (ulong)((mod[(ulong)psVar62 >> 4 & 0xfffffff] >> ((uint)psVar62 & 0xf) & 1)
                               != 0) <<
                        ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar62 & 0x3fU);
    psVar62 = (secp256k1_modinv64_modinfo *)((long)(psVar62->modulus).v + 1);
  } while ((int)psVar62 != 0x100);
  uVar40 = 0x3fffffffffffffff;
  pcStack_f0 = (code *)0x14a560;
  psVar46 = (secp256k1_modinv64_modinfo *)local_b8.modulus.v[0];
  uVar18 = modinv2p64(local_b8.modulus.v[0]);
  local_b8.modulus_inv62 = uVar18 & 0x3fffffffffffffff;
  if ((uVar18 * local_b8.modulus.v[0] & 0x3fffffffffffffff) != 1) goto LAB_0014a98f;
  if (psVar58 == (secp256k1_modinv64_modinfo *)0x0) {
LAB_0014a6e2:
    local_88.modulus_inv62 = (uint64_t)mod;
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4] = 0;
    uVar40 = 0;
    do {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar40 >> 1;
      puVar2 = (ulong *)((long)local_e8.modulus.v +
                        (ulong)((uint)((uVar40 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8
                               ));
      *puVar2 = *puVar2 | (ulong)((in[uVar40 >> 4 & 0xfffffff] >> ((uint)uVar40 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar10 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar40 & 0x3fU);
      uVar40 = uVar40 + 1;
    } while ((int)uVar40 != 0x100);
    iVar15 = 8;
    do {
      uVar40 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
               >> 0x3e;
      lVar19 = local_b8.modulus.v[uVar40];
      if ((lVar19 < 1) || (lVar28 = local_b8.modulus.v[uVar40 + 1], 0x3fffffffffffffff < lVar28)) {
        if ((lVar19 < 0) && (lVar28 = local_b8.modulus.v[uVar40 + 1], -0x4000000000000000 < lVar28))
        {
          local_b8.modulus.v[uVar40] = lVar19 + 0x4000000000000000;
          lVar28 = lVar28 + -1;
          goto LAB_0014a7d5;
        }
      }
      else {
        local_b8.modulus.v[uVar40] = lVar19 + -0x4000000000000000;
        lVar28 = lVar28 + 1;
LAB_0014a7d5:
        local_b8.modulus.v[uVar40 + 1] = lVar28;
      }
      uVar54 = secp256k1_test_state[1] << 0x11;
      uVar41 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar40 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar41;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar40;
      secp256k1_test_state[2] = uVar41 ^ uVar54;
      secp256k1_test_state[3] = uVar40 << 0x2d | uVar40 >> 0x13;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    local_e8.modulus_inv62._4_4_ = (uint)(psVar58 != (secp256k1_modinv64_modinfo *)0x0);
    psVar58 = (secp256k1_modinv64_modinfo *)0x0;
    uVar40 = 0x84210843;
    while( true ) {
      iVar15 = (int)psVar58;
      pcVar29 = secp256k1_modinv64_var;
      if (iVar15 == 0) {
        pcVar29 = secp256k1_modinv64;
      }
      pcStack_f0 = (code *)0x14a84a;
      (*pcVar29)(&local_e8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar41 = 0;
      do {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar41 >> 1;
        out[uVar41 >> 4 & 0xfffffff] =
             out[uVar41 >> 4 & 0xfffffff] |
             (ushort)((*(ulong *)((long)local_e8.modulus.v +
                                 (ulong)((uint)((uVar41 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                                        0xfffffff8)) >>
                       ((ulong)((SUB164(auVar11 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                               (int)uVar41) & 0x3f) & 1) != 0) << ((byte)uVar41 & 0xf);
        uVar41 = uVar41 + 1;
      } while ((int)uVar41 != 0x100);
      psVar46 = &local_88;
      pcStack_f0 = (code *)0x14a8ba;
      psVar62 = (secp256k1_modinv64_modinfo *)out;
      mulmod256((uint16_t *)psVar46,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((short)local_88.modulus.v[0] != (short)local_e8.modulus_inv62._4_4_) break;
      lVar19 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar19 * 2) != 0) {
          pcStack_f0 = (code *)0x14a985;
          test_modinv64_uint16_cold_4();
          goto LAB_0014a985;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      pcStack_f0 = (code *)0x14a8ed;
      (*pcVar29)(&local_e8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      psVar62 = (secp256k1_modinv64_modinfo *)0x0;
      do {
        auVar12._8_8_ = 0;
        auVar12._0_8_ = (ulong)psVar62 >> 1;
        psVar46 = (secp256k1_modinv64_modinfo *)
                  ((ulong)((*(ulong *)((long)local_e8.modulus.v +
                                      (ulong)((uint)(((ulong)psVar62 >> 1 & 0x7fffffff) * 0x84210843
                                                    >> 0x21) & 0xfffffff8)) >>
                            ((ulong)((SUB164(auVar12 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                    (int)psVar62) & 0x3f) & 1) != 0) << ((byte)psVar62 & 0xf));
        puVar3 = (ushort *)((long)local_88.modulus.v + ((ulong)psVar62 >> 4 & 0xfffffff) * 2);
        *puVar3 = *puVar3 | (ushort)psVar46;
        psVar62 = (secp256k1_modinv64_modinfo *)((long)(psVar62->modulus).v + 1);
      } while ((int)psVar62 != 0x100);
      lVar19 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar19 * 2) != in[lVar19]) goto LAB_0014a985;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      psVar58 = (secp256k1_modinv64_modinfo *)(ulong)(iVar15 + 1);
      if (iVar15 != 0) {
        return;
      }
    }
    goto LAB_0014a98a;
  }
  pcStack_f0 = (code *)0x14a59a;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4] = 0;
  uVar41 = 0;
  do {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar41 >> 1;
    puVar2 = (ulong *)((long)local_e8.modulus.v +
                      (ulong)((uint)((uVar41 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8))
    ;
    *puVar2 = *puVar2 | (ulong)((*(ushort *)
                                  ((long)local_88.modulus.v + (uVar41 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar41 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar41 & 0x3fU);
    uVar41 = uVar41 + 1;
  } while ((int)uVar41 != 0x100);
  psVar62 = &local_b8;
  pcStack_f0 = (code *)0x14a615;
  uVar14 = secp256k1_jacobi64_maybe_var(&local_e8.modulus,psVar62);
  if (1 < uVar14) goto LAB_0014a994;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x14a64e;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4] = 0;
  uVar41 = 0;
  do {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar41 >> 1;
    puVar2 = (ulong *)((long)local_e8.modulus.v +
                      (ulong)((uint)((uVar41 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8))
    ;
    *puVar2 = *puVar2 | (ulong)((*(ushort *)
                                  ((long)local_88.modulus.v + (uVar41 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar41 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar41 & 0x3fU);
    uVar41 = uVar41 + 1;
  } while ((int)uVar41 != 0x100);
  psVar62 = &local_b8;
  pcStack_f0 = (code *)0x14a6c9;
  iVar15 = secp256k1_jacobi64_maybe_var(&local_e8.modulus,psVar62);
  if ((iVar15 == 0) || (iVar15 == 1 - (*mod & 2))) goto LAB_0014a6e2;
LAB_0014a999:
  pcStack_f0 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar30 & 1) != 0) {
    iVar15 = 6;
    do {
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    return;
  }
  pcStack_f8 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_f8 = (code *)0x8421084210842109;
  puStack_100 = out;
  puStack_108 = in;
  uStack_110 = uVar40;
  psStack_118 = psVar58;
  psStack_120 = (secp256k1_modinv64_modinfo *)mod;
  sStack_168.modulus.v[4]._0_4_ = (int)(psVar62->modulus).v[4];
  sStack_168.modulus.v[2] = (psVar62->modulus).v[2];
  sStack_168.modulus.v[3] = (psVar62->modulus).v[3];
  sStack_168.modulus.v[0] = (psVar62->modulus).v[0];
  sStack_168.modulus.v[1] = (psVar62->modulus).v[1];
  iVar13 = (psVar30->modulus).v[0];
  sStack_198.modulus.v[1] = (psVar30->modulus).v[1];
  piVar1 = (psVar30->modulus).v + 2;
  sStack_198.modulus.v[2] = *piVar1;
  sStack_198.modulus.v[3] = (psVar30->modulus).v[3];
  sStack_198.modulus.v[0]._0_4_ = (uint)iVar13;
  sStack_198.modulus.v[0]._4_4_ = (uint)((ulong)iVar13 >> 0x20);
  sStack_198.modulus.v[4]._0_4_ = (int)(psVar30->modulus).v[4];
  auVar72 = packssdw(*(undefined1 (*) [16])(psVar30->modulus).v,*(undefined1 (*) [16])piVar1);
  psVar47 = psVar62;
  if (((((((((auVar72 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar72 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar72 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar72 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar72[0xf]) &&
     (-1 < (int)sStack_198.modulus.v[4])) {
    uVar14 = (uint)((ulong)sStack_198.modulus.v[1] >> 0x20) | (uint)sStack_198.modulus.v[1] |
             sStack_198.modulus.v[0]._4_4_ | (uint)sStack_198.modulus.v[0];
    psVar47 = (secp256k1_modinv64_modinfo *)(ulong)uVar14;
    psVar46 = psVar37;
    psVar65 = (secp256k1_modinv64_modinfo *)in;
    if (((int)((ulong)sStack_198.modulus.v[3] >> 0x20) != 0 ||
        (((int)sStack_198.modulus.v[3] != 0 ||
         ((int)((ulong)sStack_198.modulus.v[2] >> 0x20) != 0 || (int)sStack_198.modulus.v[2] != 0))
        || uVar14 != 0)) || (int)sStack_198.modulus.v[4] != 0) {
      psVar65 = (secp256k1_modinv64_modinfo *)0x9;
      uVar40 = 0xffffffff;
      iStack_1ac = 0;
      psVar58 = (secp256k1_modinv64_modinfo *)0x0;
      psStack_138 = psVar62;
      do {
        psVar62 = psStack_138;
        uVar27 = sStack_168.modulus.v[0]._4_4_ << 0x1e | (uint)sStack_168.modulus.v[0];
        mod = (uint16_t *)(ulong)uVar27;
        uVar39 = sStack_198.modulus.v[0]._4_4_ << 0x1e | (uint)sStack_198.modulus.v[0];
        psVar47 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
        uVar14 = 1;
        psVar55 = (secp256k1_modinv64_modinfo *)0x0;
        uVar16 = 0x1e;
        psVar30 = (secp256k1_modinv64_modinfo *)0x0;
        uVar50 = 1;
        psVar37 = (secp256k1_modinv64_modinfo *)mod;
        psVar31 = psVar58;
        uVar52 = uVar39;
        while( true ) {
          uVar53 = (uint)psVar37;
          uVar35 = -1 << ((byte)uVar16 & 0x1f) | uVar52;
          uVar22 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          bVar21 = (byte)uVar22;
          uVar52 = uVar52 >> (bVar21 & 0x1f);
          uVar50 = uVar50 << (bVar21 & 0x1f);
          uVar35 = (int)psVar30 << (bVar21 & 0x1f);
          psVar30 = (secp256k1_modinv64_modinfo *)(ulong)uVar35;
          uVar61 = (int)uVar40 - uVar22;
          uVar40 = (ulong)uVar61;
          psVar46 = (secp256k1_modinv64_modinfo *)((ulong)psVar37 >> 1);
          uVar57 = ((uint)((ulong)psVar37 >> 2) ^ (uint)psVar46) & uVar22 ^ (uint)psVar31;
          psVar58 = (secp256k1_modinv64_modinfo *)(ulong)uVar57;
          uVar16 = uVar16 - uVar22;
          uVar22 = (uint)psVar55;
          psStack_130 = psVar65;
          if (uVar16 == 0) break;
          if (((ulong)psVar37 & 1) == 0) {
            psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ade9;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_0014ade9:
            psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14adee;
            secp256k1_jacobi32_maybe_var_cold_5();
            in = (uint16_t *)psVar31;
LAB_0014adee:
            psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14adf3;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_0014adf3:
            psVar37 = psVar46;
            psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14adf8;
            secp256k1_jacobi32_maybe_var_cold_2();
LAB_0014adf8:
            psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14adfd;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_0014adfd;
          }
          if ((uVar52 & 1) == 0) goto LAB_0014ade9;
          uVar36 = uVar35 * uVar39 + uVar50 * uVar27;
          psVar46 = (secp256k1_modinv64_modinfo *)(ulong)uVar36;
          bVar21 = 0x1e - (char)uVar16;
          uVar64 = uVar53 << (bVar21 & 0x1f);
          in = (uint16_t *)(ulong)uVar64;
          if (uVar36 != uVar64) goto LAB_0014adee;
          uVar64 = uVar14 * uVar39 + uVar22 * uVar27;
          in = (uint16_t *)(ulong)uVar64;
          uVar36 = uVar52 << (bVar21 & 0x1f);
          psVar46 = (secp256k1_modinv64_modinfo *)(ulong)uVar36;
          if (uVar64 != uVar36) goto LAB_0014adf3;
          in = (uint16_t *)psVar55;
          if ((int)uVar61 < 0) {
            uVar40 = (ulong)-uVar61;
            psVar58 = (secp256k1_modinv64_modinfo *)(ulong)(uVar57 ^ (uVar52 & uVar53) >> 1);
            psVar37 = (secp256k1_modinv64_modinfo *)(ulong)uVar52;
            psVar30 = (secp256k1_modinv64_modinfo *)(ulong)uVar14;
            in = (uint16_t *)(ulong)uVar50;
            uVar50 = uVar22;
            uVar52 = uVar53;
            uVar14 = uVar35;
          }
          out = (uint16_t *)(ulong)uVar14;
          uVar22 = (int)uVar40 + 1;
          if ((int)uVar16 <= (int)uVar22) {
            uVar22 = uVar16;
          }
          if (0x1e < uVar22) goto LAB_0014adf8;
          uVar22 = (uint)(0xff << (-(char)uVar22 & 0x1fU)) >> (-(char)uVar22 & 0x1fU);
          uVar53 = secp256k1_modinv32_inv256[(uint)((ulong)psVar37 >> 1) & 0x7f] * uVar52 & uVar22;
          uVar52 = uVar53 * (int)psVar37 + uVar52;
          psVar55 = (secp256k1_modinv64_modinfo *)(ulong)(uVar53 * uVar50 + (int)in);
          uVar14 = uVar53 * (int)psVar30 + uVar14;
          psVar31 = psVar58;
          uStack_128 = uVar40;
          if ((uVar52 & uVar22) != 0) {
LAB_0014adfd:
            psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ae02;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_0014ae02;
          }
        }
        lVar19 = (long)(int)uVar14 * (long)(int)uVar50 - (long)(int)uVar22 * (long)(int)uVar35;
        out = (uint16_t *)&sStack_168;
        sStack_1a8.u = uVar50;
        sStack_1a8.v = uVar35;
        sStack_1a8.q = uVar22;
        sStack_1a8.r = uVar14;
        if ((lVar19 != -0x40000000) && (lVar19 != 0x40000000)) goto LAB_0014ae34;
        iVar23 = (int)psVar65;
        psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ac83;
        psVar47 = psVar65;
        psVar30 = (secp256k1_modinv64_modinfo *)out;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)out,iVar23,
                            (secp256k1_modinv32_signed30 *)psStack_138,0);
        psVar37 = &sStack_198;
        if (iVar15 < 1) goto LAB_0014ae07;
        psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14aca3;
        psVar47 = psVar65;
        psVar30 = (secp256k1_modinv64_modinfo *)out;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)out,iVar23,
                            (secp256k1_modinv32_signed30 *)psVar62,1);
        if (0 < iVar15) goto LAB_0014ae0c;
        psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14acbb;
        psVar47 = psVar65;
        psVar30 = psVar37;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar37,iVar23,
                            (secp256k1_modinv32_signed30 *)psVar62,0);
        if (iVar15 < 1) goto LAB_0014ae11;
        psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14acd6;
        psVar47 = psVar65;
        psVar30 = psVar37;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar37,iVar23,
                            (secp256k1_modinv32_signed30 *)psVar62,1);
        if (-1 < iVar15) goto LAB_0014ae16;
        psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14acf1;
        secp256k1_modinv32_update_fg_30_var
                  (iVar23,(secp256k1_modinv32_signed30 *)out,(secp256k1_modinv32_signed30 *)psVar37,
                   &sStack_1a8);
        if ((uint)sStack_168.modulus.v[0] == 1) {
          if (1 < iVar23) {
            uVar14 = 0;
            psVar30 = (secp256k1_modinv64_modinfo *)0x1;
            do {
              uVar14 = uVar14 | *(uint *)((long)sStack_168.modulus.v + (long)psVar30 * 4);
              psVar30 = (secp256k1_modinv64_modinfo *)((long)(psVar30->modulus).v + 1);
            } while (psVar65 != psVar30);
            if (uVar14 != 0) goto LAB_0014ad20;
          }
          iStack_1b0 = 1 - (uVar57 * 2 & 2);
          bVar67 = false;
        }
        else {
LAB_0014ad20:
          if ((-1 < iVar23 + -2 && *(int *)((long)sStack_168.modulus.v + (long)iVar23 * 4 + -4) == 0
              ) && *(int *)((long)sStack_198.modulus.v + (long)iVar23 * 4 + -4) == 0) {
            psVar65 = (secp256k1_modinv64_modinfo *)(ulong)(iVar23 - 1);
          }
          psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ad4a;
          iVar23 = (int)psVar65;
          psVar47 = psVar65;
          psVar30 = (secp256k1_modinv64_modinfo *)out;
          iVar15 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)out,iVar23,
                              (secp256k1_modinv32_signed30 *)psVar62,0);
          if (iVar15 < 1) goto LAB_0014ae1b;
          psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ad65;
          psVar47 = psVar65;
          psVar30 = (secp256k1_modinv64_modinfo *)out;
          iVar15 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)out,iVar23,
                              (secp256k1_modinv32_signed30 *)psVar62,1);
          if (0 < iVar15) goto LAB_0014ae20;
          psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ad7d;
          psVar47 = psVar65;
          psVar30 = psVar37;
          iVar15 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar37,iVar23,
                              (secp256k1_modinv32_signed30 *)psVar62,0);
          if (iVar15 < 1) goto LAB_0014ae25;
          psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ad98;
          psVar47 = psVar65;
          psVar30 = psVar37;
          iVar15 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar37,iVar23,
                              (secp256k1_modinv32_signed30 *)psVar62,1);
          bVar67 = true;
          if (-1 < iVar15) goto LAB_0014ae2a;
        }
        if ((!bVar67) || (iStack_1ac = iStack_1ac + 1, iStack_1ac == 0x19)) {
          return;
        }
      } while( true );
    }
  }
  else {
LAB_0014ae02:
    psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ae07;
    secp256k1_jacobi32_maybe_var_cold_17();
    psVar62 = (secp256k1_modinv64_modinfo *)mod;
    psVar65 = (secp256k1_modinv64_modinfo *)in;
LAB_0014ae07:
    psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ae0c;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_0014ae0c:
    psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ae11;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_0014ae11:
    psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ae16;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_0014ae16:
    psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ae1b;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_0014ae1b:
    psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ae20;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_0014ae20:
    psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ae25;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_0014ae25:
    psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ae2a;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_0014ae2a:
    psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ae2f;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar46 = psVar37;
  }
  psStack_1c0 = (secp256k1_modinv64_modinfo *)0x14ae34;
  secp256k1_jacobi32_maybe_var_cold_16();
LAB_0014ae34:
  psStack_1c0 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  psStack_1c0 = psVar46;
  psStack_1c8 = (secp256k1_modinv64_modinfo *)out;
  psStack_1d0 = psVar65;
  uStack_1d8 = uVar40;
  psStack_1e0 = psVar58;
  psStack_1e8 = psVar62;
  psVar37 = (secp256k1_modinv64_modinfo *)0x0;
  sStack_240.modulus.v[4]._0_4_ = 0;
  sStack_240.modulus.v[2] = 0;
  sStack_240.modulus.v[3] = 0;
  sStack_240.modulus.v[0] = 0;
  sStack_240.modulus.v[1] = 0;
  sStack_210.v[2] = 0;
  sStack_210.v[3] = 0;
  sStack_210.v[8] = 0;
  sStack_210.v[4] = 0;
  sStack_210.v[5] = 0;
  sStack_210.v[6] = 0;
  sStack_210.v[7] = 0;
  sStack_210.v[0] = 1;
  sStack_210.v[1] = 0;
  sStack_2b0.modulus.v[4]._0_4_ = (int)(psVar47->modulus).v[4];
  sStack_2b0.modulus.v[2] = (psVar47->modulus).v[2];
  sStack_2b0.modulus.v[3] = (psVar47->modulus).v[3];
  sStack_2b0.modulus.v[0] = (psVar47->modulus).v[0];
  sStack_2b0.modulus.v[1] = (psVar47->modulus).v[1];
  sStack_280.modulus.v[4]._0_4_ = (int)(psVar30->modulus).v[4];
  sStack_280.modulus.v[0] = (psVar30->modulus).v[0];
  sStack_280.modulus.v[1] = (psVar30->modulus).v[1];
  sStack_280.modulus_inv62 = (uint64_t)psVar30;
  sStack_280.modulus.v[2] = (psVar30->modulus).v[2];
  sStack_280.modulus.v[3] = (psVar30->modulus).v[3];
  modinfo = (secp256k1_modinv32_modinfo *)0xffffffff;
  psVar30 = (secp256k1_modinv64_modinfo *)0x9;
  puVar38 = secp256k1_modinv32_inv256;
  psStack_250 = psVar47;
  do {
    psVar46 = psStack_250;
    uStack_2c4 = (uint)psVar37;
    psVar59 = (secp256k1_modinv32_modinfo *)(sStack_2b0.modulus.v[0] & 0xffffffff);
    psVar58 = (secp256k1_modinv64_modinfo *)(sStack_280.modulus.v[0] & 0xffffffff);
    uVar14 = 1;
    psVar65 = (secp256k1_modinv64_modinfo *)0x0;
    iVar15 = 0x1e;
    uVar16 = 0;
    psVar62 = (secp256k1_modinv64_modinfo *)0x1;
    uVar50 = (uint)sStack_2b0.modulus.v[0];
    uVar52 = (uint)sStack_280.modulus.v[0];
    while( true ) {
      uVar27 = -1 << ((byte)iVar15 & 0x1f) | uVar52;
      psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uVar27;
      iVar23 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> iVar23 & 1) == 0; iVar23 = iVar23 + 1) {
        }
      }
      bVar21 = (byte)iVar23;
      uVar52 = uVar52 >> (bVar21 & 0x1f);
      uVar39 = (int)psVar62 << (bVar21 & 0x1f);
      psVar62 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
      uVar16 = uVar16 << (bVar21 & 0x1f);
      uVar27 = (int)modinfo - iVar23;
      modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar27;
      iVar15 = iVar15 - iVar23;
      iVar23 = (int)psVar65;
      psStack_248 = psVar30;
      if (iVar15 == 0) break;
      if ((uVar50 & 1) == 0) {
        pcStack_2d8 = (code *)0x14b313;
        secp256k1_modinv32_var_cold_7();
LAB_0014b313:
        pcStack_2d8 = (code *)0x14b318;
        secp256k1_modinv32_var_cold_6();
LAB_0014b318:
        pcStack_2d8 = (code *)0x14b31d;
        secp256k1_modinv32_var_cold_1();
LAB_0014b31d:
        pcStack_2d8 = (code *)0x14b322;
        secp256k1_modinv32_var_cold_2();
LAB_0014b322:
        pcStack_2d8 = (code *)0x14b327;
        secp256k1_modinv32_var_cold_5();
LAB_0014b327:
        pcStack_2d8 = (code *)0x14b32c;
        secp256k1_modinv32_var_cold_4();
        goto LAB_0014b32c;
      }
      if ((uVar52 & 1) == 0) goto LAB_0014b313;
      uVar22 = uVar16 * (uint)sStack_280.modulus.v[0] + uVar39 * (uint)sStack_2b0.modulus.v[0];
      psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uVar22;
      bVar21 = 0x1e - (char)iVar15;
      uVar53 = uVar50 << (bVar21 & 0x1f);
      psVar37 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      if (uVar22 != uVar53) goto LAB_0014b318;
      uVar53 = uVar14 * (uint)sStack_280.modulus.v[0] + iVar23 * (uint)sStack_2b0.modulus.v[0];
      psVar37 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      uVar22 = uVar52 << (bVar21 & 0x1f);
      psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uVar22;
      if (uVar53 != uVar22) goto LAB_0014b31d;
      if (uVar27 - 0x2f0 < 0xfffffa21) goto LAB_0014b322;
      psVar37 = psVar65;
      if ((int)uVar27 < 0) {
        modinfo = (secp256k1_modinv32_modinfo *)(ulong)-uVar27;
        uVar27 = -uVar50;
        uVar22 = -uVar16;
        psVar62 = psVar65;
        psVar37 = (secp256k1_modinv64_modinfo *)(ulong)-uVar39;
        uVar50 = uVar52;
        uVar52 = uVar27;
        uVar16 = uVar14;
        uVar14 = uVar22;
      }
      psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uVar14;
      iVar23 = (int)modinfo + 1;
      if (iVar15 <= iVar23) {
        iVar23 = iVar15;
      }
      if (iVar23 - 0x1fU < 0xffffffe2) goto LAB_0014b327;
      uVar39 = (uint)(0xff << (-(char)iVar23 & 0x1fU)) >> (-(char)iVar23 & 0x1fU);
      psVar47 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
      uVar27 = secp256k1_modinv32_inv256[uVar50 >> 1 & 0x7f] * uVar52 & uVar39;
      uVar52 = uVar52 + uVar27 * uVar50;
      psVar65 = (secp256k1_modinv64_modinfo *)(ulong)(uVar27 * (int)psVar62 + (int)psVar37);
      uVar14 = uVar27 * uVar16 + uVar14;
      if ((uVar52 & uVar39) != 0) {
LAB_0014b32c:
        pcStack_2d8 = (code *)0x14b331;
        secp256k1_modinv32_var_cold_3();
        goto LAB_0014b331;
      }
    }
    sStack_2c0.u = uVar39;
    sStack_2c0.v = uVar16;
    sStack_2c0.q = iVar23;
    sStack_2c0.r = uVar14;
    if ((long)(int)uVar14 * (long)(int)uVar39 - (long)iVar23 * (long)(int)uVar16 != 0x40000000) {
LAB_0014b331:
      pcStack_2d8 = (code *)0x14b336;
      secp256k1_modinv32_var_cold_8();
      psVar30 = psVar31;
      psVar46 = psVar47;
LAB_0014b336:
      pcStack_2d8 = (code *)0x14b33b;
      secp256k1_modinv32_var_cold_19();
LAB_0014b33b:
      pcStack_2d8 = (code *)0x14b340;
      secp256k1_modinv32_var_cold_18();
LAB_0014b340:
      pcStack_2d8 = (code *)0x14b345;
      secp256k1_modinv32_var_cold_17();
LAB_0014b345:
      pcStack_2d8 = (code *)0x14b34a;
      secp256k1_modinv32_var_cold_16();
LAB_0014b34a:
      pcStack_2d8 = (code *)0x14b34f;
      secp256k1_modinv32_var_cold_13();
LAB_0014b34f:
      pcStack_2d8 = (code *)0x14b354;
      secp256k1_modinv32_var_cold_12();
LAB_0014b354:
      pcStack_2d8 = (code *)0x14b359;
      secp256k1_modinv32_var_cold_11();
LAB_0014b359:
      pcStack_2d8 = (code *)0x14b35e;
      secp256k1_modinv32_var_cold_10();
LAB_0014b35e:
      pcStack_2d8 = (code *)0x14b363;
      secp256k1_modinv32_var_cold_9();
      goto LAB_0014b363;
    }
    pcStack_2d8 = (code *)0x14b078;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)&sStack_240,&sStack_210,&sStack_2c0,
               (secp256k1_modinv32_modinfo *)psStack_250);
    psVar30 = psStack_248;
    psVar62 = &sStack_2b0;
    iVar23 = (int)psStack_248;
    psVar59 = (secp256k1_modinv32_modinfo *)((ulong)psStack_248 & 0xffffffff);
    pcStack_2d8 = (code *)0x14b097;
    psVar58 = psVar62;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar62,iVar23,
                        (secp256k1_modinv32_signed30 *)psVar46,-1);
    if (iVar15 < 1) goto LAB_0014b336;
    psVar59 = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
    pcStack_2d8 = (code *)0x14b0b1;
    psVar58 = psVar62;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar62,iVar23,
                        (secp256k1_modinv32_signed30 *)psVar46,1);
    if (0 < iVar15) goto LAB_0014b33b;
    psVar37 = &sStack_280;
    psVar59 = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
    pcStack_2d8 = (code *)0x14b0d0;
    psVar58 = psVar37;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar37,iVar23,
                        (secp256k1_modinv32_signed30 *)psVar46,-1);
    if (iVar15 < 1) goto LAB_0014b340;
    psVar59 = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
    pcStack_2d8 = (code *)0x14b0ea;
    psVar58 = psVar37;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar37,iVar23,
                        (secp256k1_modinv32_signed30 *)psVar46,1);
    if (-1 < iVar15) goto LAB_0014b345;
    pcStack_2d8 = (code *)0x14b104;
    secp256k1_modinv32_update_fg_30_var
              (iVar23,(secp256k1_modinv32_signed30 *)psVar62,(secp256k1_modinv32_signed30 *)psVar37,
               &sStack_2c0);
    uVar14 = uStack_2c4;
    psVar37 = (secp256k1_modinv64_modinfo *)(ulong)uStack_2c4;
    if ((uint)sStack_280.modulus.v[0] != 0) {
LAB_0014b114:
      uVar50 = *(uint *)((long)sStack_2b0.modulus.v + (long)iVar23 * 4 + -4);
      uVar52 = *(uint *)((long)sStack_280.modulus.v + (long)iVar23 * 4 + -4);
      iVar15 = iVar23 + -2;
      uVar16 = (int)uVar50 >> 0x1f ^ uVar50 | iVar15 >> 0x1f;
      psVar58 = (secp256k1_modinv64_modinfo *)(ulong)uVar16;
      uVar16 = (int)uVar52 >> 0x1f ^ uVar52 | uVar16;
      psVar59 = (secp256k1_modinv32_modinfo *)(ulong)uVar16;
      if (uVar16 == 0) {
        psVar30 = (secp256k1_modinv64_modinfo *)(ulong)(iVar23 - 1);
        puVar4 = (uint *)((long)sStack_2b0.modulus.v + (long)iVar15 * 4);
        *puVar4 = *puVar4 | uVar50 << 0x1e;
        puVar4 = (uint *)((long)sStack_280.modulus.v + (long)iVar15 * 4);
        *puVar4 = *puVar4 | uVar52 << 0x1e;
      }
      if (0x17 < (int)uStack_2c4) goto LAB_0014b34a;
      iVar23 = (int)psVar30;
      psVar59 = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
      pcStack_2d8 = (code *)0x14b16a;
      psVar58 = psVar62;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar62,iVar23,
                          (secp256k1_modinv32_signed30 *)psVar46,-1);
      if (iVar15 < 1) goto LAB_0014b34f;
      psVar59 = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
      pcStack_2d8 = (code *)0x14b184;
      psVar58 = psVar62;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar62,iVar23,
                          (secp256k1_modinv32_signed30 *)psVar46,1);
      if (0 < iVar15) goto LAB_0014b354;
      psVar62 = &sStack_280;
      psVar59 = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
      pcStack_2d8 = (code *)0x14b1a3;
      psVar58 = psVar62;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar62,iVar23,
                          (secp256k1_modinv32_signed30 *)psVar46,-1);
      if (iVar15 < 1) goto LAB_0014b359;
      psVar59 = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
      pcStack_2d8 = (code *)0x14b1bd;
      psVar58 = psVar62;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar62,iVar23,
                          (secp256k1_modinv32_signed30 *)psVar46,1);
      if (iVar15 < 0) {
        psVar37 = (secp256k1_modinv64_modinfo *)(ulong)(uVar14 + 1);
        uVar50 = 1;
        goto LAB_0014b1f0;
      }
      goto LAB_0014b35e;
    }
    uVar50 = 0;
    if (1 < iVar23) {
      uVar40 = 1;
      do {
        uVar50 = uVar50 | *(uint *)((long)sStack_280.modulus.v + uVar40 * 4);
        uVar40 = uVar40 + 1;
      } while (((ulong)psVar30 & 0xffffffff) != uVar40);
      if (uVar50 != 0) goto LAB_0014b114;
      uVar50 = 0;
    }
LAB_0014b1f0:
    psVar47 = psVar46;
  } while ((char)uVar50 != '\0');
  psVar58 = &sStack_280;
  iVar23 = (int)psVar30;
  psVar59 = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
  pcStack_2d8 = (code *)0x14b20d;
  iVar15 = secp256k1_modinv32_mul_cmp_30
                     ((secp256k1_modinv32_signed30 *)psVar58,iVar23,&SECP256K1_SIGNED30_ONE,0);
  if (iVar15 == 0) {
    pcStack_2d8 = (code *)0x14b22d;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_2b0,iVar23,&SECP256K1_SIGNED30_ONE,-1
                       );
    psVar37 = (secp256k1_modinv64_modinfo *)sStack_280.modulus_inv62;
    if (iVar15 == 0) {
LAB_0014b2cb:
      pcStack_2d8 = (code *)0x14b2e5;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)&sStack_240,
                 *(int32_t *)((long)sStack_2b0.modulus.v + (long)iVar23 * 4 + -4),
                 (secp256k1_modinv32_modinfo *)psVar46);
      *(undefined4 *)((psVar37->modulus).v + 4) = (undefined4)sStack_240.modulus.v[4];
      (psVar37->modulus).v[2] = sStack_240.modulus.v[2];
      (psVar37->modulus).v[3] = sStack_240.modulus.v[3];
      (psVar37->modulus).v[0] = sStack_240.modulus.v[0];
      (psVar37->modulus).v[1] = sStack_240.modulus.v[1];
      return;
    }
    pcStack_2d8 = (code *)0x14b252;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_2b0,iVar23,&SECP256K1_SIGNED30_ONE,1)
    ;
    if (iVar15 == 0) goto LAB_0014b2cb;
    psVar59 = (secp256k1_modinv32_modinfo *)0x9;
    pcStack_2d8 = (code *)0x14b26c;
    psVar58 = psVar37;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar37,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar15 == 0) {
      psVar58 = &sStack_240;
      psVar59 = (secp256k1_modinv32_modinfo *)0x9;
      pcStack_2d8 = (code *)0x14b28f;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar58,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar15 == 0) {
        pcStack_2d8 = (code *)0x14b2ab;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)&sStack_2b0,iVar23,
                            (secp256k1_modinv32_signed30 *)psVar46,1);
        if (iVar15 == 0) goto LAB_0014b2cb;
        psVar58 = &sStack_2b0;
        psVar59 = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
        pcStack_2d8 = (code *)0x14b2c3;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar58,iVar23,
                            (secp256k1_modinv32_signed30 *)psVar46,-1);
        if (iVar15 == 0) goto LAB_0014b2cb;
      }
    }
  }
  else {
LAB_0014b363:
    pcStack_2d8 = (code *)0x14b368;
    secp256k1_modinv32_var_cold_14();
  }
  pcStack_2d8 = secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  pcStack_2d8 = (code *)secp256k1_modinv32_inv256;
  psStack_2e0 = psVar46;
  psStack_2e8 = psVar37;
  psStack_2f0 = psVar62;
  psStack_2f8 = modinfo;
  psStack_300 = psVar30;
  uVar14 = 0;
  sStack_358.modulus.v[4]._0_4_ = 0;
  sStack_358.modulus.v[2] = 0;
  sStack_358.modulus.v[3] = 0;
  sStack_358.modulus.v[0] = 0;
  sStack_358.modulus.v[1] = 0;
  sStack_328.v[2] = 0;
  sStack_328.v[3] = 0;
  sStack_328.v[8] = 0;
  sStack_328.v[4] = 0;
  sStack_328.v[5] = 0;
  sStack_328.v[6] = 0;
  sStack_328.v[7] = 0;
  sStack_328.v[0] = 1;
  sStack_328.v[1] = 0;
  sStack_3d8.modulus.v[4]._0_4_ = (psVar59->modulus).v[8];
  sStack_3d8.modulus.v[2] = *(int64_t *)((psVar59->modulus).v + 4);
  sStack_3d8.modulus.v[3] = *(int64_t *)((psVar59->modulus).v + 6);
  sStack_3d8.modulus.v[0] = *(int64_t *)(psVar59->modulus).v;
  sStack_3d8.modulus.v[1] = *(int64_t *)((psVar59->modulus).v + 2);
  sStack_398.modulus.v[4]._0_4_ = (int)(psVar58->modulus).v[4];
  sStack_398.modulus.v[0] = (psVar58->modulus).v[0];
  sStack_398.modulus.v[1] = (psVar58->modulus).v[1];
  psStack_368 = psVar58;
  sStack_398.modulus.v[2] = (psVar58->modulus).v[2];
  sStack_398.modulus.v[3] = (psVar58->modulus).v[3];
  uVar40 = 0xffffffff;
  psStack_3f0 = psVar59;
  do {
    lStack_360 = (long)(int)(uint)sStack_3d8.modulus.v[0];
    uVar54 = (ulong)(int)(uint)sStack_398.modulus.v[0];
    uVar41 = 0;
    psVar47 = (secp256k1_modinv64_modinfo *)0x1;
    uVar50 = 0;
    uVar27 = 0;
    uVar39 = 1;
    uVar52 = (uint)sStack_398.modulus.v[0];
    uVar16 = (uint)sStack_3d8.modulus.v[0];
    do {
      uVar22 = (uint)sStack_3d8.modulus.v[0];
      uStack_3e4 = uVar14;
      if ((uVar16 & 1) == 0) {
        psStack_400 = (secp256k1_modinv64_modinfo *)0x14b843;
        secp256k1_modinv32_cold_17();
LAB_0014b843:
        psStack_400 = (secp256k1_modinv64_modinfo *)0x14b848;
        secp256k1_modinv32_cold_1();
LAB_0014b848:
        psStack_400 = (secp256k1_modinv64_modinfo *)0x14b84d;
        secp256k1_modinv32_cold_2();
        psVar59 = modinfo;
LAB_0014b84d:
        psStack_400 = (secp256k1_modinv64_modinfo *)0x14b852;
        secp256k1_modinv32_cold_16();
        goto LAB_0014b852;
      }
      uVar57 = (uint)psVar47;
      uVar35 = uVar50 * (uint)sStack_398.modulus.v[0] + uVar57 * (uint)sStack_3d8.modulus.v[0];
      puVar38 = (uint8_t *)(ulong)uVar35;
      uVar53 = uVar16 << ((byte)uVar41 & 0x1f);
      psVar30 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      if (uVar35 != uVar53) goto LAB_0014b843;
      uVar35 = uVar39 * (uint)sStack_398.modulus.v[0] + uVar27 * (uint)sStack_3d8.modulus.v[0];
      puVar38 = (uint8_t *)(ulong)uVar35;
      uVar53 = uVar52 << ((byte)uVar41 & 0x1f);
      psVar30 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      if (uVar35 != uVar53) goto LAB_0014b848;
      uStack_3dc = (int)(uint)uVar40 >> 0x1f;
      puVar38 = (uint8_t *)(ulong)uStack_3dc;
      uStack_3e0 = uVar52 & 1;
      uVar53 = -uStack_3e0;
      psVar37 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      uVar35 = uStack_3dc & uVar53;
      psVar30 = (secp256k1_modinv64_modinfo *)(ulong)uVar35;
      uVar61 = (uint)uVar40 ^ uVar35;
      uVar40 = (ulong)uVar61;
      psVar59 = (secp256k1_modinv32_modinfo *)(ulong)(uVar61 - 0x25b);
      if (uVar61 - 0x25b < 0xfffffb4d) goto LAB_0014b84d;
      uVar40 = (ulong)(uVar61 - 1);
      uVar39 = uVar39 + ((uStack_3dc ^ uVar50) - uStack_3dc & uVar53);
      uVar50 = (uVar50 + (uVar39 & uVar35)) * 2;
      uVar27 = uVar27 + ((uStack_3dc ^ uVar57) - uStack_3dc & uVar53);
      uVar57 = (uVar57 + (uVar27 & uVar35)) * 2;
      psVar47 = (secp256k1_modinv64_modinfo *)(ulong)uVar57;
      uVar53 = ((uStack_3dc ^ uVar16) - uStack_3dc & uVar53) + uVar52;
      uVar52 = uVar53 >> 1;
      uVar53 = uVar53 & uVar35;
      modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar53;
      uVar16 = uVar16 + uVar53;
      uVar53 = (int)uVar41 + 1;
      uVar41 = (ulong)uVar53;
    } while (uVar53 != 0x1e);
    psVar30 = (secp256k1_modinv64_modinfo *)(long)(int)uVar57;
    psVar37 = (secp256k1_modinv64_modinfo *)(long)(int)uVar39;
    puVar38 = (uint8_t *)(long)(int)uVar50;
    psVar59 = (secp256k1_modinv32_modinfo *)(long)(int)uVar27;
    uVar41 = (long)psVar30 * (long)psVar37 - (long)puVar38 * (long)psVar59;
    sStack_3a8.u = uVar57;
    sStack_3a8.v = uVar50;
    sStack_3a8.q = uVar27;
    sStack_3a8.r = uVar39;
    if (uVar41 != 0x40000000) {
LAB_0014b852:
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b857;
      secp256k1_modinv32_cold_3();
LAB_0014b857:
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b85c;
      secp256k1_modinv32_cold_15();
LAB_0014b85c:
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b861;
      secp256k1_modinv32_cold_14();
LAB_0014b861:
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b866;
      secp256k1_modinv32_cold_13();
LAB_0014b866:
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b86b;
      secp256k1_modinv32_cold_12();
LAB_0014b86b:
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b870;
      secp256k1_modinv32_cold_4();
LAB_0014b870:
      modinfo = psVar59;
      uVar14 = (uint)uVar41;
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b875;
      secp256k1_modinv32_cold_5();
LAB_0014b875:
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b87a;
      secp256k1_modinv32_cold_11();
LAB_0014b87a:
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b87f;
      secp256k1_modinv32_cold_10();
LAB_0014b87f:
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b884;
      secp256k1_modinv32_cold_9();
LAB_0014b884:
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b889;
      secp256k1_modinv32_cold_8();
      goto LAB_0014b889;
    }
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b556;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)&sStack_358,&sStack_328,&sStack_3a8,psStack_3f0);
    psVar47 = &sStack_3d8;
    uVar22 = 9;
    uVar41 = 0xffffffff;
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b56f;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar47,9,&psStack_3f0->modulus,-1);
    if (iVar15 < 1) goto LAB_0014b857;
    psVar47 = &sStack_3d8;
    uVar22 = 9;
    uVar41 = 1;
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b590;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar47,9,&psStack_3f0->modulus,1);
    if (0 < iVar15) goto LAB_0014b85c;
    psVar47 = &sStack_398;
    uVar22 = 9;
    uVar41 = 0xffffffff;
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b5b1;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar47,9,&psStack_3f0->modulus,-1);
    if (iVar15 < 1) goto LAB_0014b861;
    psVar47 = &sStack_398;
    uVar22 = 9;
    uVar41 = 1;
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b5d2;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar47,9,&psStack_3f0->modulus,1);
    modinfo = psStack_3f0;
    if (-1 < iVar15) goto LAB_0014b866;
    uVar41 = (long)psVar30 * lStack_360;
    uVar20 = (long)puVar38 * uVar54 + uVar41;
    if ((uVar20 & 0x3ffffffe) != 0) goto LAB_0014b86b;
    uVar54 = uVar54 * (long)psVar37 + lStack_360 * (long)psVar59;
    if ((uVar54 & 0x3fffffff) != 0) goto LAB_0014b870;
    uVar54 = (long)uVar54 >> 0x1e;
    lVar19 = (long)uVar20 >> 0x1e;
    lVar28 = 1;
    do {
      lVar25 = (long)*(int *)((long)sStack_3d8.modulus.v + lVar28 * 4);
      lVar42 = (long)*(int *)((long)sStack_398.modulus.v + lVar28 * 4);
      lVar19 = lVar42 * (long)puVar38 + lVar25 * (long)psVar30 + lVar19;
      lVar25 = lVar42 * (long)psVar37 + lVar25 * (long)psVar59 + uVar54;
      (&uStack_3dc)[lVar28] = (uint)lVar19 & 0x3fffffff;
      *(uint *)((long)sStack_398.modulus.v + lVar28 * 4 + -4) = (uint)lVar25 & 0x3fffffff;
      lVar28 = lVar28 + 1;
      uVar54 = lVar25 >> 0x1e;
      lVar19 = lVar19 >> 0x1e;
    } while (lVar28 != 9);
    sStack_3d8.modulus.v[4]._0_4_ = (int32_t)lVar19;
    sStack_398.modulus.v[4]._0_4_ = (undefined4)uVar54;
    psVar30 = &sStack_3d8;
    uVar22 = 9;
    uVar14 = 0xffffffff;
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b6a6;
    psVar47 = psVar30;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar30,9,&psStack_3f0->modulus,-1);
    if (iVar15 < 1) goto LAB_0014b875;
    uVar22 = 9;
    uVar14 = 1;
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b6c3;
    psVar47 = psVar30;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar30,9,&modinfo->modulus,1);
    if (0 < iVar15) goto LAB_0014b87a;
    psVar30 = &sStack_398;
    uVar22 = 9;
    uVar14 = 0xffffffff;
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b6e5;
    psVar47 = psVar30;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar30,9,&modinfo->modulus,-1);
    if (iVar15 < 1) goto LAB_0014b87f;
    uVar22 = 9;
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b702;
    psVar47 = psVar30;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar30,9,&modinfo->modulus,1);
    uVar14 = uStack_3e4;
    if (-1 < iVar15) goto LAB_0014b884;
    uVar14 = uStack_3e4 + 1;
  } while (uVar14 != 0x14);
  psVar47 = &sStack_398;
  uVar22 = 9;
  uVar14 = 0;
  psStack_400 = (secp256k1_modinv64_modinfo *)0x14b731;
  iVar15 = secp256k1_modinv32_mul_cmp_30
                     ((secp256k1_modinv32_signed30 *)psVar47,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar15 == 0) {
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b754;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_3d8,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar37 = psStack_368;
    if (iVar15 == 0) {
LAB_0014b7fe:
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b815;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)&sStack_358,(int32_t)sStack_3d8.modulus.v[4],modinfo
                );
      *(undefined4 *)((psVar37->modulus).v + 4) = (undefined4)sStack_358.modulus.v[4];
      (psVar37->modulus).v[2] = sStack_358.modulus.v[2];
      (psVar37->modulus).v[3] = sStack_358.modulus.v[3];
      (psVar37->modulus).v[0] = sStack_358.modulus.v[0];
      (psVar37->modulus).v[1] = sStack_358.modulus.v[1];
      return;
    }
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b77f;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_3d8,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar15 == 0) goto LAB_0014b7fe;
    uVar22 = 9;
    uVar14 = 0;
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b799;
    psVar47 = psVar37;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar37,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar15 == 0) {
      psVar47 = &sStack_358;
      uVar22 = 9;
      uVar14 = 0;
      psStack_400 = (secp256k1_modinv64_modinfo *)0x14b7bc;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar47,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar15 == 0) {
        psStack_400 = (secp256k1_modinv64_modinfo *)0x14b7db;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)&sStack_3d8,9,&modinfo->modulus,1);
        if (iVar15 == 0) goto LAB_0014b7fe;
        psVar47 = &sStack_3d8;
        uVar22 = 9;
        uVar14 = 0xffffffff;
        psStack_400 = (secp256k1_modinv64_modinfo *)0x14b7f6;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar47,9,&modinfo->modulus,-1);
        if (iVar15 == 0) goto LAB_0014b7fe;
      }
    }
  }
  else {
LAB_0014b889:
    psStack_400 = (secp256k1_modinv64_modinfo *)0x14b88e;
    secp256k1_modinv32_cold_6();
  }
  psStack_400 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_450;
  piVar32 = (int *)(ulong)uVar14;
  pcStack_458 = (code *)0x14b8b3;
  psStack_408 = psVar30;
  psStack_400 = psVar37;
  secp256k1_modinv32_mul_30(&sStack_42c,(secp256k1_modinv32_signed30 *)psVar47,uVar22,1);
  pcStack_458 = (code *)0x14b8c5;
  piVar56 = piVar32;
  psVar43 = a_00;
  secp256k1_modinv32_mul_30(&sStack_450,a_00,9,uVar14);
  lVar19 = 0;
  while ((uint)sStack_42c.v[lVar19] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_450.v[lVar19]) goto LAB_0014b917;
    lVar19 = lVar19 + 1;
    if (lVar19 == 8) {
      uVar14 = 8;
      while( true ) {
        if (sStack_42c.v[uVar14] < sStack_450.v[uVar14]) {
          return;
        }
        if (sStack_450.v[uVar14] < sStack_42c.v[uVar14]) break;
        bVar67 = uVar14 == 0;
        uVar14 = uVar14 - 1;
        if (bVar67) {
          return;
        }
      }
      return;
    }
  }
  pcStack_458 = (code *)0x14b917;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_0014b917:
  pcStack_458 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar15 = (int)a_01;
  piStack_480 = piVar32;
  psStack_478 = modinfo;
  uStack_470 = uVar54;
  uStack_460 = uVar40;
  pcStack_458 = (code *)puVar38;
  if (iVar15 < 1) {
    psStack_490 = (secp256k1_modinv32_signed30 *)0x14ba0a;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014ba0a:
    iVar24 = (int)piVar56;
    psStack_490 = (secp256k1_modinv32_signed30 *)0x14ba0f;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar23 = piVar56[1];
    iVar5 = *piVar56;
    piVar32 = (int *)(long)psVar43->v[0];
    uVar41 = (long)*extraout_RDX * (long)iVar23 + (long)piVar32 * (long)iVar5;
    if ((uVar41 & 0x3fffffff) != 0) goto LAB_0014ba0a;
    iVar6 = piVar56[3];
    iVar24 = piVar56[2];
    piVar32 = (int *)((long)piVar32 * (long)iVar24);
    piVar56 = (int *)((long)*extraout_RDX * (long)iVar6 + (long)piVar32);
    if (((ulong)piVar56 & 0x3fffffff) == 0) {
      lVar28 = (long)piVar56 >> 0x1e;
      lVar19 = (long)uVar41 >> 0x1e;
      if (iVar15 != 1) {
        uVar40 = 1;
        do {
          lVar19 = (long)extraout_RDX[uVar40] * (long)iVar23 +
                   (long)psVar43->v[uVar40] * (long)iVar5 + lVar19;
          lVar28 = (long)extraout_RDX[uVar40] * (long)iVar6 +
                   (long)psVar43->v[uVar40] * (long)iVar24 + lVar28;
          psVar43->v[uVar40 - 1] = (uint)lVar19 & 0x3fffffff;
          extraout_RDX[uVar40 - 1] = (uint)lVar28 & 0x3fffffff;
          uVar40 = uVar40 + 1;
          lVar28 = lVar28 >> 0x1e;
          lVar19 = lVar19 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar40);
      }
      psVar43->v[(long)iVar15 + -1] = (int32_t)lVar19;
      extraout_RDX[(long)iVar15 + -1] = (int)lVar28;
      return;
    }
  }
  psStack_490 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar19 = 0;
  psStack_490 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar19 < extraout_EDX) {
      psStack_490 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_490->v + (long)psVar43->v[lVar19] * (long)iVar24);
    }
    a_01->v[lVar19] = (uint)psStack_490 & 0x3fffffff;
    psStack_490 = (secp256k1_modinv32_signed30 *)((long)psStack_490 >> 0x1e);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 8);
  if (8 < extraout_EDX) {
    psStack_490 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_490->v + (long)psVar43->v[8] * (long)iVar24);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_490;
  if (b == psStack_490) {
    a_01->v[8] = (int)psStack_490;
    return;
  }
  pcStack_498 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar14 = *extraout_RDX_00;
  psVar63 = (secp256k1_modinv32_signed30 *)(long)(int)uVar14;
  uVar50 = extraout_RDX_00[1];
  lVar19 = (long)(int)uVar50;
  uVar52 = extraout_RDX_00[2];
  psVar33 = (secp256k1_modinv32_signed30 *)(long)(int)uVar52;
  lStack_4d0 = (long)(int)extraout_RDX_00[3];
  psVar44 = (secp256k1_fe *)0x9;
  pcStack_4e0 = (code *)0x14baa9;
  a_02 = a_01;
  piStack_4c0 = piVar32;
  psStack_4b8 = modinfo;
  uStack_4b0 = uVar54;
  uStack_4a0 = uVar40;
  pcStack_498 = (code *)puVar38;
  iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar15 < 1) {
    pcStack_4e0 = (code *)0x14bd11;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014bd11:
    pcStack_4e0 = (code *)0x14bd16;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014bd16:
    pcStack_4e0 = (code *)0x14bd1b;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014bd1b:
    pcStack_4e0 = (code *)0x14bd20;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014bd20:
    pcStack_4e0 = (code *)0x14bd25;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014bd25:
    pcStack_4e0 = (code *)0x14bd2a;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014bd2a:
    pcStack_4e0 = (code *)0x14bd2f;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014bd2f:
    pcStack_4e0 = (code *)0x14bd34;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar60 = b;
LAB_0014bd34:
    pcStack_4e0 = (code *)0x14bd39;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014bd39:
    pcStack_4e0 = (code *)0x14bd3e;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014bd3e:
    pcStack_4e0 = (code *)0x14bd43;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar44 = (secp256k1_fe *)0x9;
    pcStack_4e0 = (code *)0x14bac6;
    a_02 = a_01;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar15) goto LAB_0014bd11;
    psVar44 = (secp256k1_fe *)0x9;
    pcStack_4e0 = (code *)0x14bae3;
    a_02 = psVar43;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar43,9,b,-2);
    if (iVar15 < 1) goto LAB_0014bd16;
    psVar44 = (secp256k1_fe *)0x9;
    pcStack_4e0 = (code *)0x14bb00;
    a_02 = psVar43;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar43,9,b,1);
    if (-1 < iVar15) goto LAB_0014bd1b;
    psVar60 = (secp256k1_modinv32_signed30 *)-(long)psVar63;
    if (0 < (long)psVar63) {
      psVar60 = psVar63;
    }
    lVar28 = -lVar19;
    if (lVar19 < 1) {
      lVar28 = lVar19;
    }
    if (lVar28 + 0x40000000 < (long)psVar60) goto LAB_0014bd20;
    psVar60 = (secp256k1_modinv32_signed30 *)-(long)psVar33;
    if (0 < (long)psVar33) {
      psVar60 = psVar33;
    }
    lVar28 = -lStack_4d0;
    if (lStack_4d0 < 1) {
      lVar28 = lStack_4d0;
    }
    if (lVar28 + 0x40000000 < (long)psVar60) goto LAB_0014bd25;
    uVar27 = a_01->v[8] >> 0x1f;
    uVar16 = psVar43->v[8] >> 0x1f;
    psVar44 = (secp256k1_fe *)(ulong)uVar16;
    iVar15 = (uVar16 & uVar50) + (uVar27 & uVar14);
    a_02 = (secp256k1_modinv32_signed30 *)
           (psVar43->v[0] * lVar19 + (long)a_01->v[0] * (long)psVar63);
    lVar28 = (long)(int)(iVar15 - ((int)a_02 * b[1].v[0] + iVar15 & 0x3fffffffU));
    piVar26 = (int32_t *)((long)a_02->v + lVar28 * b->v[0]);
    if (((ulong)piVar26 & 0x3fffffff) != 0) goto LAB_0014bd2a;
    lStack_4c8 = lVar28;
    iVar15 = (uVar16 & (uint)lStack_4d0) + (uVar27 & uVar52);
    lVar25 = psVar43->v[0] * lStack_4d0 + (long)a_01->v[0] * (long)psVar33;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar14 = iVar15 - (b[1].v[0] * (int)lVar25 + iVar15 & 0x3fffffffU);
    psVar44 = (secp256k1_fe *)(ulong)uVar14;
    uVar40 = (long)b->v[0] * (long)(int)uVar14 + lVar25;
    if ((uVar40 & 0x3fffffff) != 0) goto LAB_0014bd2f;
    lVar25 = (long)uVar40 >> 0x1e;
    lVar42 = (long)piVar26 >> 0x1e;
    lVar48 = 1;
    do {
      lVar42 = b->v[lVar48] * lVar28 + psVar43->v[lVar48] * lVar19 +
               (long)a_01->v[lVar48] * (long)psVar63 + lVar42;
      psVar60 = (secp256k1_modinv32_signed30 *)(psVar43->v[lVar48] * lStack_4d0);
      lVar25 = (long)psVar60->v +
               (long)a_01->v[lVar48] * (long)psVar33 + lVar25 +
               (long)b->v[lVar48] * (long)(int)uVar14;
      a_01->v[lVar48 + -1] = (uint)lVar42 & 0x3fffffff;
      psVar43->v[lVar48 + -1] = (uint)lVar25 & 0x3fffffff;
      lVar48 = lVar48 + 1;
      lVar25 = lVar25 >> 0x1e;
      lVar42 = lVar42 >> 0x1e;
    } while (lVar48 != 9);
    a_01->v[8] = (int32_t)lVar42;
    psVar43->v[8] = (int32_t)lVar25;
    psVar44 = (secp256k1_fe *)0x9;
    pcStack_4e0 = (code *)0x14bcaa;
    a_02 = a_01;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar33 = psVar43;
    psVar63 = b;
    if (iVar15 < 1) goto LAB_0014bd34;
    psVar44 = (secp256k1_fe *)0x9;
    pcStack_4e0 = (code *)0x14bcc7;
    a_02 = a_01;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar15) goto LAB_0014bd39;
    psVar44 = (secp256k1_fe *)0x9;
    pcStack_4e0 = (code *)0x14bce0;
    a_02 = psVar43;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar43,9,b,-2);
    if (iVar15 < 1) goto LAB_0014bd3e;
    psVar44 = (secp256k1_fe *)0x9;
    pcStack_4e0 = (code *)0x14bcf9;
    a_02 = psVar43;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar43,9,b,1);
    if (iVar15 < 0) {
      return;
    }
  }
  pcStack_4e0 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_4e0 = (code *)lVar19;
  psStack_4e8 = a_01;
  psStack_4f0 = psVar43;
  psStack_4f8 = psVar63;
  psStack_500 = psVar60;
  psStack_508 = psVar33;
  uVar14 = a_02->v[0];
  uVar49 = (ulong)uVar14;
  uVar50 = a_02->v[3];
  uVar20 = (ulong)uVar50;
  uVar52 = a_02->v[4];
  uVar41 = (ulong)uVar52;
  uVar16 = a_02->v[5];
  uVar54 = (ulong)uVar16;
  psVar43 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar27 = a_02->v[7];
  uVar40 = (ulong)uVar27;
  iStack_50c = a_02->v[8];
  lVar19 = 0;
  do {
    if (a_02->v[lVar19] < -0x3fffffff) {
      pcStack_548 = (code *)0x14c091;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014c091:
      pcStack_548 = (code *)0x14c096;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014c096;
    }
    if (0x3fffffff < a_02->v[lVar19]) goto LAB_0014c091;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 9);
  uStack_52c = (uint)psVar44;
  psVar44 = (secp256k1_fe *)0x9;
  pcStack_548 = (code *)0x14bdce;
  psVar43 = a_02;
  uStack_538 = a_02->v[1];
  uStack_534 = a_02->v[2];
  uStack_530 = a_02->v[6];
  psStack_528 = b_00;
  iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar15 < 1) {
LAB_0014c096:
    pcStack_548 = (code *)0x14c09b;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014c09b:
    pcStack_548 = (code *)0x14c0a0;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014c0a0:
    pcStack_548 = (code *)0x14c0a5;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014c0a5:
    pcStack_548 = (code *)0x14c0aa;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar44 = (secp256k1_fe *)0x9;
    pcStack_548 = (code *)0x14bded;
    psVar43 = a_02;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_528,1);
    if (-1 < iVar15) goto LAB_0014c09b;
    uVar39 = iStack_50c >> 0x1f;
    uStack_510 = psStack_528->v[1];
    uVar22 = (uVar39 & uStack_510) + uStack_538;
    uStack_538 = psStack_528->v[2];
    uVar53 = (uVar39 & uStack_538) + uStack_534;
    uStack_534 = psStack_528->v[3];
    uStack_514 = psStack_528->v[4];
    uStack_518 = psStack_528->v[5];
    uStack_51c = psStack_528->v[6];
    uVar61 = (uVar39 & uStack_51c) + uStack_530;
    uStack_530 = psStack_528->v[7];
    uStack_53c = (int)uStack_52c >> 0x1f;
    uStack_52c = psStack_528->v[8];
    uVar57 = ((uVar39 & psStack_528->v[0]) + uVar14 ^ uStack_53c) - uStack_53c;
    uVar35 = ((int)uVar57 >> 0x1e) + ((uVar22 ^ uStack_53c) - uStack_53c);
    uVar22 = ((int)uVar35 >> 0x1e) + ((uVar53 ^ uStack_53c) - uStack_53c);
    uVar64 = ((int)uVar22 >> 0x1e) + (((uVar39 & uStack_534) + uVar50 ^ uStack_53c) - uStack_53c);
    uVar50 = ((int)uVar64 >> 0x1e) + (((uVar39 & uStack_514) + uVar52 ^ uStack_53c) - uStack_53c);
    uVar14 = ((int)uVar50 >> 0x1e) + (((uVar39 & uStack_518) + uVar16 ^ uStack_53c) - uStack_53c);
    uVar52 = ((int)uVar14 >> 0x1e) + ((uVar61 ^ uStack_53c) - uStack_53c);
    uVar16 = ((int)uVar52 >> 0x1e) + (((uVar39 & uStack_530) + uVar27 ^ uStack_53c) - uStack_53c);
    uVar36 = ((int)uVar16 >> 0x1e) +
             (((uVar39 & uStack_52c) + iStack_50c ^ uStack_53c) - uStack_53c);
    uVar54 = (ulong)uVar36;
    uStack_540 = (int)uVar36 >> 0x1f;
    uVar61 = (psStack_528->v[0] & uStack_540) + (uVar57 & 0x3fffffff);
    uVar53 = (uStack_518 & uStack_540) + (uVar14 & 0x3fffffff);
    uVar49 = (ulong)uVar53;
    uVar57 = (uStack_51c & uStack_540) + (uVar52 & 0x3fffffff);
    uVar20 = (ulong)uVar57;
    uVar14 = ((int)uVar61 >> 0x1e) + (uStack_510 & uStack_540) + (uVar35 & 0x3fffffff);
    uVar52 = ((int)uVar14 >> 0x1e) + (uStack_538 & uStack_540) + (uVar22 & 0x3fffffff);
    uVar27 = ((int)uVar52 >> 0x1e) + (uStack_534 & uStack_540) + (uVar64 & 0x3fffffff);
    uVar39 = ((int)uVar27 >> 0x1e) + (uStack_514 & uStack_540) + (uVar50 & 0x3fffffff);
    uVar53 = ((int)uVar39 >> 0x1e) + uVar53;
    uVar57 = ((int)uVar53 >> 0x1e) + uVar57;
    uVar50 = ((int)uVar57 >> 0x1e) + (uStack_530 & uStack_540) + (uVar16 & 0x3fffffff);
    uVar16 = ((int)uVar50 >> 0x1e) + (uStack_52c & uStack_540) + uVar36;
    uVar41 = (ulong)uVar16;
    uVar27 = uVar27 & 0x3fffffff;
    psVar44 = (secp256k1_fe *)(ulong)uVar27;
    uVar39 = uVar39 & 0x3fffffff;
    psVar43 = (secp256k1_modinv32_signed30 *)(ulong)uVar39;
    uVar50 = uVar50 & 0x3fffffff;
    uVar40 = (ulong)uVar50;
    a_02->v[0] = uVar61 & 0x3fffffff;
    a_02->v[1] = uVar14 & 0x3fffffff;
    a_02->v[2] = uVar52 & 0x3fffffff;
    a_02->v[3] = uVar27;
    a_02->v[4] = uVar39;
    a_02->v[5] = uVar53 & 0x3fffffff;
    a_02->v[6] = uVar57 & 0x3fffffff;
    a_02->v[7] = uVar50;
    a_02->v[8] = uVar16;
    if (0x3fffffff < uVar16) goto LAB_0014c0a0;
    psVar44 = (secp256k1_fe *)0x9;
    pcStack_548 = (code *)0x14c05e;
    psVar43 = a_02;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_528,0);
    if (iVar15 < 0) goto LAB_0014c0a5;
    psVar44 = (secp256k1_fe *)0x9;
    pcStack_548 = (code *)0x14c079;
    psVar43 = a_02;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_528,1);
    if (iVar15 < 0) {
      return;
    }
  }
  pcStack_548 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r = &sStack_608;
  psVar34 = &sStack_608;
  pcVar29 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar29 = secp256k1_fe_inv;
  }
  pcStack_610 = (code *)0x14c0e0;
  uStack_570 = uVar40;
  uStack_568 = uVar54;
  uStack_560 = uVar20;
  psStack_558 = a_02;
  uStack_550 = uVar49;
  pcStack_548 = (code *)uVar41;
  (*pcVar29)(&sStack_608);
  if (psVar43 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar43->v + 8) = sStack_608.n[4];
    *(ulong *)(psVar43[1].v + 1) = CONCAT44(sStack_608.normalized,sStack_608.magnitude);
    *(uint64_t *)(psVar43->v + 4) = sStack_608.n[2];
    *(uint64_t *)(psVar43->v + 6) = sStack_608.n[3];
    *(uint64_t *)psVar43->v = sStack_608.n[0];
    *(uint64_t *)(psVar43->v + 2) = sStack_608.n[1];
  }
  uVar41 = 0xffffffffffff;
  sStack_5a8.n[0] = psVar44->n[0];
  sStack_5a8.n[1] = psVar44->n[1];
  sStack_5a8.n[2] = psVar44->n[2];
  sStack_5a8.n[3] = psVar44->n[3];
  sStack_5a8.n[4] = psVar44->n[4];
  sStack_5a8.magnitude = psVar44->magnitude;
  sStack_5a8.normalized = psVar44->normalized;
  psVar45 = &sStack_5a8;
  pcStack_610 = (code *)0x14c149;
  secp256k1_fe_verify(psVar45);
  uVar40 = (sStack_5a8.n[4] >> 0x30) * 0x1000003d1 + sStack_5a8.n[0];
  if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
    uVar54 = (uVar40 >> 0x34) + sStack_5a8.n[1];
    uVar20 = (uVar54 >> 0x34) + sStack_5a8.n[2];
    uVar49 = (uVar20 >> 0x34) + sStack_5a8.n[3];
    uVar51 = (uVar49 >> 0x34) + (sStack_5a8.n[4] & 0xffffffffffff);
    if ((((uVar54 | uVar40 | uVar20 | uVar49) & 0xfffffffffffff) != 0 || uVar51 != 0) &&
       (((uVar40 | 0x1000003d0) & uVar54 & uVar20 & uVar49 & (uVar51 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c1f0;
LAB_0014c5ba:
    pcStack_610 = (code *)0x14c5c5;
    secp256k1_fe_verify(&sStack_608);
    uVar41 = sStack_608.n[4] & 0xffffffffffff;
    uVar40 = (sStack_608.n[4] >> 0x30) * 0x1000003d1 + sStack_608.n[0];
    uVar54 = (uVar40 >> 0x34) + sStack_608.n[1];
    uVar20 = (uVar54 >> 0x34) + sStack_608.n[2];
    r = (secp256k1_fe *)((uVar20 >> 0x34) + sStack_608.n[3]);
    uVar49 = ((ulong)r >> 0x34) + uVar41;
    if ((((uVar54 | uVar40 | uVar20 | (ulong)r) & 0xfffffffffffff) == 0 && uVar49 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar49 ^ 0xf000000000000), psVar34 = &sStack_608,
       ((uVar40 ^ 0x1000003d0) & uVar54 & uVar20 & (ulong)r & (ulong)r_00) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_0014c1f0:
    pcStack_610 = (code *)0x14c203;
    psVar45 = psVar44;
    secp256k1_fe_mul(&sStack_5a8,psVar44,&sStack_608);
    pcStack_610 = (code *)0x14c20b;
    secp256k1_fe_verify(&sStack_5a8);
    r_00 = &fe_minus_one;
    pcStack_610 = (code *)0x14c217;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_5a8.magnitude < 0x20) {
      sStack_5a8.n[0] = sStack_5a8.n[0] + 0xffffefffffc2e;
      sStack_5a8.n[1] = sStack_5a8.n[1] + 0xfffffffffffff;
      sStack_5a8.n[2] = sStack_5a8.n[2] + 0xfffffffffffff;
      sStack_5a8.n[3] = sStack_5a8.n[3] + 0xfffffffffffff;
      sStack_5a8.n[4] = sStack_5a8.n[4] + 0xffffffffffff;
      sStack_5a8.normalized = 0;
      sStack_5a8.magnitude = sStack_5a8.magnitude + 1;
      pcStack_610 = (code *)0x14c269;
      secp256k1_fe_verify(&sStack_5a8);
      pcStack_610 = (code *)0x14c271;
      secp256k1_fe_verify(&sStack_5a8);
      uVar40 = (sStack_5a8.n[4] >> 0x30) * 0x1000003d1 + sStack_5a8.n[0];
      uVar54 = (uVar40 >> 0x34) + sStack_5a8.n[1];
      uVar20 = (uVar54 >> 0x34) + sStack_5a8.n[2];
      psVar45 = (secp256k1_fe *)((uVar20 >> 0x34) + sStack_5a8.n[3]);
      uVar49 = ((ulong)psVar45 >> 0x34) + (sStack_5a8.n[4] & 0xffffffffffff);
      if ((((uVar54 | uVar40 | uVar20 | (ulong)psVar45) & 0xfffffffffffff) != 0 || uVar49 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar49 ^ 0xf000000000000),
         ((uVar40 ^ 0x1000003d0) & uVar54 & uVar20 & (ulong)psVar45 & (ulong)r_00) !=
         0xfffffffffffff)) goto LAB_0014c658;
      sStack_5d8.n[0] = psVar44->n[0];
      sStack_5d8.n[1] = psVar44->n[1];
      sStack_5d8.n[2] = psVar44->n[2];
      sStack_5d8.n[3] = psVar44->n[3];
      sStack_5d8.n[4] = psVar44->n[4];
      sStack_5d8.magnitude = psVar44->magnitude;
      sStack_5d8.normalized = psVar44->normalized;
      psVar44 = &sStack_5d8;
      pcStack_610 = (code *)0x14c317;
      secp256k1_fe_verify(psVar44);
      r_00 = &fe_minus_one;
      pcStack_610 = (code *)0x14c323;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_5d8.magnitude) goto LAB_0014c65d;
      sStack_5d8.n[0] = sStack_5d8.n[0] + 0xffffefffffc2e;
      sStack_5d8.n[1] = sStack_5d8.n[1] + 0xfffffffffffff;
      sStack_5d8.n[2] = sStack_5d8.n[2] + 0xfffffffffffff;
      sStack_5d8.n[3] = sStack_5d8.n[3] + 0xfffffffffffff;
      sStack_5d8.n[4] = sStack_5d8.n[4] + 0xffffffffffff;
      sStack_5d8.normalized = 0;
      sStack_5d8.magnitude = sStack_5d8.magnitude + 1;
      pcStack_610 = (code *)0x14c36e;
      secp256k1_fe_verify(&sStack_5d8);
      pcStack_610 = (code *)0x14c376;
      secp256k1_fe_verify(&sStack_5d8);
      uVar40 = (sStack_5d8.n[4] >> 0x30) * 0x1000003d1 + sStack_5d8.n[0];
      if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
        uVar54 = (uVar40 >> 0x34) + sStack_5d8.n[1];
        uVar20 = (uVar54 >> 0x34) + sStack_5d8.n[2];
        uVar49 = (uVar20 >> 0x34) + sStack_5d8.n[3];
        uVar51 = (uVar49 >> 0x34) + (sStack_5d8.n[4] & 0xffffffffffff);
        if (((uVar54 | uVar40 | uVar20 | uVar49) & 0xfffffffffffff) == 0 && uVar51 == 0) {
          return;
        }
        if (((uVar40 | 0x1000003d0) & uVar54 & uVar20 & uVar49 & (uVar51 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar45 = &sStack_5d8;
      pcStack_610 = (code *)0x14c425;
      (*pcVar29)();
      pcStack_610 = (code *)0x14c430;
      secp256k1_fe_verify(&sStack_608);
      r_00 = &fe_minus_one;
      pcStack_610 = (code *)0x14c43c;
      secp256k1_fe_verify(&fe_minus_one);
      psVar44 = &sStack_608;
      if (0x1f < sStack_608.magnitude) goto LAB_0014c662;
      sStack_608.n[0] = sStack_608.n[0] + 0xffffefffffc2e;
      sStack_608.n[1] = sStack_608.n[1] + 0xfffffffffffff;
      sStack_608.n[2] = sStack_608.n[2] + 0xfffffffffffff;
      sStack_608.n[3] = sStack_608.n[3] + 0xfffffffffffff;
      sStack_608.n[4] = sStack_608.n[4] + 0xffffffffffff;
      sStack_608.magnitude = sStack_608.magnitude + 1;
      sStack_608.normalized = 0;
      pcStack_610 = (code *)0x14c485;
      secp256k1_fe_verify(&sStack_608);
      pcStack_610 = (code *)0x14c48e;
      (*pcVar29)(&sStack_608);
      pcStack_610 = (code *)0x14c496;
      secp256k1_fe_verify(&sStack_608);
      sStack_608.n[0] = sStack_608.n[0] + 1;
      sStack_608.magnitude = sStack_608.magnitude + 1;
      sStack_608.normalized = 0;
      pcStack_610 = (code *)0x14c4a8;
      secp256k1_fe_verify(&sStack_608);
      pcStack_610 = (code *)0x14c4b0;
      secp256k1_fe_verify(&sStack_608);
      psVar45 = &sStack_5d8;
      pcStack_610 = (code *)0x14c4bd;
      r_00 = psVar45;
      secp256k1_fe_verify(psVar45);
      if (sStack_5d8.magnitude + sStack_608.magnitude < 0x21) {
        sStack_608.n[0] = sStack_608.n[0] + sStack_5d8.n[0];
        sStack_608.n[1] = sStack_608.n[1] + sStack_5d8.n[1];
        sStack_608.n[2] = sStack_608.n[2] + sStack_5d8.n[2];
        sStack_608.n[3] = sStack_608.n[3] + sStack_5d8.n[3];
        sStack_608.n[4] = sStack_608.n[4] + sStack_5d8.n[4];
        sStack_608.normalized = 0;
        pcStack_610 = (code *)0x14c509;
        sStack_608.magnitude = sStack_5d8.magnitude + sStack_608.magnitude;
        secp256k1_fe_verify(&sStack_608);
        pcStack_610 = (code *)0x14c511;
        secp256k1_fe_verify(&sStack_608);
        uVar40 = (sStack_608.n[4] >> 0x30) * 0x1000003d1 + sStack_608.n[0];
        if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
          uVar41 = (uVar40 >> 0x34) + sStack_608.n[1];
          uVar54 = (uVar41 >> 0x34) + sStack_608.n[2];
          uVar20 = (uVar54 >> 0x34) + sStack_608.n[3];
          uVar49 = (uVar20 >> 0x34) + (sStack_608.n[4] & 0xffffffffffff);
          if (((uVar41 | uVar40 | uVar54 | uVar20) & 0xfffffffffffff) == 0 && uVar49 == 0) {
            return;
          }
          if (((uVar40 | 0x1000003d0) & uVar41 & uVar54 & uVar20 & (uVar49 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_610 = (code *)0x14c5ba;
        test_inverse_field_cold_2();
        goto LAB_0014c5ba;
      }
    }
    else {
      pcStack_610 = (code *)0x14c658;
      test_inverse_field_cold_7();
LAB_0014c658:
      pcStack_610 = (code *)0x14c65d;
      test_inverse_field_cold_6();
LAB_0014c65d:
      pcStack_610 = (code *)0x14c662;
      test_inverse_field_cold_5();
LAB_0014c662:
      r = psVar45;
      psVar34 = psVar44;
      psVar45 = &sStack_5a8;
      pcStack_610 = (code *)0x14c667;
      test_inverse_field_cold_4();
    }
    pcStack_610 = (code *)0x14c66c;
    test_inverse_field_cold_3();
  }
  pcStack_610 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_610 = (code *)0xfffffffffffff;
  psVar44 = (secp256k1_fe *)auStack_680;
  pcVar66 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar66 = secp256k1_scalar_inverse;
  }
  pcStack_688 = (code *)0x14c69a;
  auStack_640._32_8_ = psVar34;
  auStack_640._40_8_ = psVar45;
  (*pcVar66)(auStack_680);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_680._20_4_,auStack_680._16_4_);
    r_00->n[3] = CONCAT44(auStack_680._28_4_,auStack_680._24_4_);
    r_00->n[0] = CONCAT44(auStack_680._4_4_,auStack_680._0_4_);
    r_00->n[1] = CONCAT44(auStack_680._12_4_,auStack_680._8_4_);
  }
  pcStack_688 = (code *)0x14c6b9;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar68._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar68._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar68._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar68._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar15 = movmskps(extraout_EAX,auVar68);
  if (iVar15 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_640;
    pcStack_688 = (code *)0x14c6ed;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_680);
    pcStack_688 = (code *)0x14c6f5;
    psVar34 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_640._0_8_ != 1 || auStack_640._8_8_ != 0) || auStack_640._16_8_ != 0) ||
        auStack_640._24_8_ != 0) {
      pcStack_688 = (code *)0x14c7ff;
      test_inverse_scalar_cold_1();
      goto LAB_0014c7ff;
    }
    pcStack_688 = (code *)0x14c725;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_680 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_688 = (code *)0x14c72d;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_680 + 0x20));
    auVar69._0_4_ = -(uint)(iStack_650 == 0 && auStack_680._32_4_ == 0);
    auVar69._4_4_ = -(uint)(iStack_64c == 0 && iStack_65c == 0);
    auVar69._8_4_ = -(uint)(iStack_648 == 0 && iStack_658 == 0);
    auVar69._12_4_ = -(uint)(iStack_644 == 0 && iStack_654 == 0);
    iVar15 = movmskps(extraout_EAX_00,auVar69);
    if (iVar15 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_680 + 0x20);
    pcStack_688 = (code *)0x14c75e;
    (*pcVar66)(a,a);
    pcStack_688 = (code *)0x14c773;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_680,&scalar_minus_one,(secp256k1_scalar *)auStack_680);
    pcStack_688 = (code *)0x14c77c;
    (*pcVar66)(auStack_680,auStack_680);
    pcStack_688 = (code *)0x14c78e;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_680,(secp256k1_scalar *)auStack_680,&secp256k1_scalar_one
              );
    pcStack_688 = (code *)0x14c79c;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_680,a,(secp256k1_scalar *)auStack_680);
    pcStack_688 = (code *)0x14c7a4;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_680);
    auVar70._0_4_ = -(uint)(auStack_680._16_4_ == 0 && auStack_680._0_4_ == 0);
    auVar70._4_4_ = -(uint)(auStack_680._20_4_ == 0 && auStack_680._4_4_ == 0);
    auVar70._8_4_ = -(uint)(auStack_680._24_4_ == 0 && auStack_680._8_4_ == 0);
    auVar70._12_4_ = -(uint)(auStack_680._28_4_ == 0 && auStack_680._12_4_ == 0);
    iVar15 = movmskps(extraout_EAX_01,auVar70);
    if (iVar15 == 0xf) {
      return;
    }
    pcStack_688 = (code *)0x14c7c8;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_680;
  }
  pcStack_688 = (code *)0x14c7d3;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_680);
  auVar71._0_4_ = -(uint)(auStack_680._16_4_ == 0 && auStack_680._0_4_ == 0);
  auVar71._4_4_ = -(uint)(auStack_680._20_4_ == 0 && auStack_680._4_4_ == 0);
  auVar71._8_4_ = -(uint)(auStack_680._24_4_ == 0 && auStack_680._8_4_ == 0);
  auVar71._12_4_ = -(uint)(auStack_680._28_4_ == 0 && auStack_680._12_4_ == 0);
  iVar15 = movmskps(extraout_EAX_02,auVar71);
  r = (secp256k1_fe *)auStack_680;
  psVar34 = psVar44;
  if (iVar15 == 0xf) {
    return;
  }
LAB_0014c7ff:
  pcStack_688 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_6a0 = 0x1000003d1;
  __s = auStack_1738;
  psStack_6b0 = r;
  pcStack_6a8 = pcVar29;
  psStack_698 = r_00;
  pcStack_690 = pcVar66;
  pcStack_688 = (code *)uVar41;
  memset(__s,0,0x1081);
  uStack_1748 = 0;
  lVar19 = 0x41;
  psStack_1740 = psVar34;
  secp256k1_hsort(__s,0x41,(size_t)psVar34,test_hsort_cmp,&uStack_1748);
  if (0x3f < uStack_1748) {
    test_hsort_is_sorted(auStack_1738,0x41,(size_t)psVar34);
    if (0 < COUNT) {
      iVar15 = 0;
      do {
        uVar17 = testrand_int(0x41);
        count = (size_t)(int)uVar17;
        testrand_bytes_test(auStack_1738,count * (long)psVar34);
        secp256k1_hsort(auStack_1738,count,(size_t)psVar34,test_hsort_cmp,&uStack_1748);
        test_hsort_is_sorted(auStack_1738,count,(size_t)psVar34);
        iVar15 = iVar15 + 1;
      } while (iVar15 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar28 = 0;
    do {
      if (__s[lVar28] != *(uchar *)(lVar19 + lVar28)) {
        return;
      }
      lVar28 = lVar28 + 1;
    } while (extraout_RDX_01[1] != lVar28);
  }
  return;
LAB_0014a985:
  pcStack_f0 = (code *)0x14a98a;
  test_modinv64_uint16_cold_5();
LAB_0014a98a:
  pcStack_f0 = (code *)0x14a98f;
  test_modinv64_uint16_cold_3();
  mod = (uint16_t *)pcVar29;
LAB_0014a98f:
  pcStack_f0 = (code *)0x14a994;
  test_modinv64_uint16_cold_1();
  psVar47 = psVar46;
LAB_0014a994:
  psVar30 = psVar47;
  pcStack_f0 = (code *)0x14a999;
  test_modinv64_uint16_cold_6();
  goto LAB_0014a999;
}

Assistant:

static void test_modinv64_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    static const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    uint16_t tmp[16];
    secp256k1_modinv64_signed62 x;
    secp256k1_modinv64_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed62(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4]) != 0;
    uint16_to_signed62(&m.modulus, mod);

    /* compute 1/modulus mod 2^62 */
    m.modulus_inv62 = modinv2p64(m.modulus.v[0]) & M62;
    CHECK(((m.modulus_inv62 * m.modulus.v[0]) & M62) == 1);

    /* Test secp256k1_jacobi64_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed62(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed62(&x, sqr);
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed62(&x, in);
    mutate_sign_signed62(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* produce output */
        signed62_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* check if the result is equal to the input */
        signed62_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}